

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_ssse3.c
# Opt level: O0

void av1_lowbd_inv_txfm2d_add_h_identity_ssse3
               (int32_t *input,uint8_t *output,int stride,TX_TYPE tx_type,TX_SIZE tx_size,int eob)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined8 uVar3;
  int iVar4;
  byte in_CL;
  long lVar5;
  int in_EDX;
  long in_RSI;
  __m128i *palVar7;
  __m128i *palVar8;
  byte in_R8B;
  int in_R9D;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qb;
  __m128i alVar9;
  __m128i res_00;
  __m128i u;
  __m128i res;
  __m128i v;
  int j_1;
  uint8_t *out;
  int step;
  int k;
  __m128i mshift;
  int32_t *input_cur;
  __m128i *buf0_cur;
  int j;
  __m128i buf0 [64];
  int i;
  int lr_flip;
  int ud_flip;
  transform_1d_ssse3 col_txfm;
  int fun_idx;
  int rect_type;
  int input_stride;
  int buf_size_h_div8;
  int buf_size_w_div8;
  int txfm_size_row;
  int txfm_size_col;
  int txh_idx;
  int txw_idx;
  int eoby;
  int eobx;
  int8_t *shift;
  int local_594;
  int local_58c;
  int local_54c;
  undefined8 *local_548;
  int local_53c;
  __m128i *in_stack_fffffffffffffad0;
  __m128i *in_stack_fffffffffffffad8;
  int local_50c;
  longlong local_508 [8];
  int in_stack_fffffffffffffb38;
  int in_stack_fffffffffffffb3c;
  int in_stack_fffffffffffffb40;
  int in_stack_fffffffffffffb44;
  int32_t *in_stack_fffffffffffffb48;
  __m128i *in_stack_fffffffffffffb50;
  int in_stack_fffffffffffffdf0;
  int local_fc;
  int local_f8;
  uint local_f4;
  transform_1d_ssse3 local_f0;
  int local_e4;
  int local_e0;
  int local_dc;
  int local_d8;
  int local_d4;
  int local_d0;
  int local_cc;
  int local_c8;
  int local_c4;
  int local_c0;
  int local_bc;
  int8_t *local_b8;
  byte local_a6;
  byte local_a5;
  int local_a4;
  long local_a0;
  undefined2 local_8a;
  undefined8 local_88;
  __m128i *palStack_80;
  longlong local_78;
  longlong lStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 *local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 *local_30;
  undefined8 local_28;
  __m128i *palStack_20;
  undefined2 local_10;
  undefined2 local_e;
  undefined2 local_c;
  undefined2 local_a;
  undefined2 local_8;
  undefined2 local_6;
  undefined2 local_4;
  undefined2 local_2;
  ulong uVar6;
  
  local_b8 = av1_inv_txfm_shift_ls[in_R8B];
  local_a6 = in_R8B;
  local_a5 = in_CL;
  local_a4 = in_EDX;
  local_a0 = in_RSI;
  get_eobx_eoby_scan_h_identity(&local_bc,&local_c0,in_R8B,in_R9D);
  local_c4 = get_txw_idx(local_a6);
  local_c8 = get_txh_idx(local_a6);
  local_cc = tx_size_wide[local_a6];
  local_d0 = tx_size_high[local_a6];
  local_d4 = local_bc + 8 >> 3;
  local_d8 = local_c0 + 8 >> 3;
  local_58c = local_d0;
  if (0x20 < local_d0) {
    local_58c = 0x20;
  }
  local_dc = local_58c;
  local_e0 = get_rect_tx_log_ratio(local_cc,local_d0);
  local_e4 = lowbd_txfm_all_1d_zeros_idx[local_c0];
  local_f0 = lowbd_txfm_all_1d_zeros_w8_arr[local_c8][""[local_a5]][local_e4];
  get_flip_cfg(local_a5,(int *)&local_f4,&local_f8);
  for (local_fc = 0; local_fc < local_d4; local_fc = local_fc + 1) {
    for (local_50c = 0; local_50c < local_d8; local_50c = local_50c + 1) {
      iidentity_row_8xn_ssse3
                (in_stack_fffffffffffffb50,in_stack_fffffffffffffb48,in_stack_fffffffffffffb44,
                 in_stack_fffffffffffffb40,in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38,
                 in_stack_fffffffffffffdf0);
      transpose_16bit_8x8(in_stack_fffffffffffffad8,in_stack_fffffffffffffad0);
    }
    palVar7 = (__m128i *)local_508;
    palVar8 = palVar7;
    (*local_f0)(palVar7,palVar7);
    local_8a = (undefined2)(1 << (local_b8[1] + 0xfU & 0x1f));
    local_2 = local_8a;
    local_4 = local_8a;
    local_6 = local_8a;
    local_8 = local_8a;
    local_a = local_8a;
    local_c = local_8a;
    local_e = local_8a;
    local_10 = local_8a;
    uVar3 = CONCAT26(local_8a,CONCAT24(local_8a,CONCAT22(local_8a,local_8a)));
    in_stack_fffffffffffffad0 =
         (__m128i *)CONCAT26(local_8a,CONCAT24(local_8a,CONCAT22(local_8a,local_8a)));
    local_28 = uVar3;
    palStack_20 = in_stack_fffffffffffffad0;
    if (local_f4 == 0) {
      local_594 = 0;
    }
    else {
      local_594 = local_d0 + -1;
    }
    local_53c = local_594;
    uVar6 = (ulong)local_f4;
    iVar4 = 1;
    if (local_f4 != 0) {
      iVar4 = -1;
    }
    lVar5 = (long)(local_fc << 3);
    local_548 = (undefined8 *)(local_a0 + lVar5);
    for (local_54c = 0; local_54c < local_d0; local_54c = local_54c + 1) {
      local_50 = local_548;
      local_68 = *local_548;
      uStack_60 = 0;
      local_78 = local_508[(long)local_53c * 2];
      lStack_70 = local_508[(long)local_53c * 2 + 1];
      auVar2._8_8_ = lStack_70;
      auVar2._0_8_ = local_78;
      auVar1._8_8_ = in_stack_fffffffffffffad0;
      auVar1._0_8_ = uVar3;
      pmulhrsw(auVar2,auVar1);
      alVar9[1] = (longlong)palVar7;
      alVar9[0] = (longlong)palVar8;
      res_00[1] = lVar5;
      res_00[0] = uVar6;
      local_88 = uVar3;
      palStack_80 = in_stack_fffffffffffffad0;
      alVar9 = lowbd_get_recon_8x8_sse2(alVar9,res_00);
      uVar6 = alVar9[1];
      local_30 = local_548;
      local_48 = extraout_XMM0_Qa;
      uStack_40 = extraout_XMM0_Qb;
      *local_548 = extraout_XMM0_Qa;
      lVar5 = (long)local_a4;
      local_548 = (undefined8 *)((long)local_548 + lVar5);
      local_53c = iVar4 + local_53c;
    }
  }
  return;
}

Assistant:

void av1_lowbd_inv_txfm2d_add_h_identity_ssse3(const int32_t *input,
                                               uint8_t *output, int stride,
                                               TX_TYPE tx_type, TX_SIZE tx_size,
                                               int eob) {
  const int8_t *shift = av1_inv_txfm_shift_ls[tx_size];
  int eobx, eoby;
  get_eobx_eoby_scan_h_identity(&eobx, &eoby, tx_size, eob);
  const int txw_idx = get_txw_idx(tx_size);
  const int txh_idx = get_txh_idx(tx_size);
  const int txfm_size_col = tx_size_wide[tx_size];
  const int txfm_size_row = tx_size_high[tx_size];
  const int buf_size_w_div8 = (eobx + 8) >> 3;
  const int buf_size_h_div8 = (eoby + 8) >> 3;
  const int input_stride = AOMMIN(32, txfm_size_row);
  const int rect_type = get_rect_tx_log_ratio(txfm_size_col, txfm_size_row);

  const int fun_idx = lowbd_txfm_all_1d_zeros_idx[eoby];
  assert(fun_idx < 5);
  const transform_1d_ssse3 col_txfm =
      lowbd_txfm_all_1d_zeros_w8_arr[txh_idx][vitx_1d_tab[tx_type]][fun_idx];

  assert(col_txfm != NULL);

  int ud_flip, lr_flip;
  get_flip_cfg(tx_type, &ud_flip, &lr_flip);
  for (int i = 0; i < buf_size_w_div8; i++) {
    __m128i buf0[64];
    for (int j = 0; j < buf_size_h_div8; j++) {
      __m128i *buf0_cur = buf0 + j * 8;
      const int32_t *input_cur = input + i * 8 * input_stride + j * 8;
      iidentity_row_8xn_ssse3(buf0_cur, input_cur, input_stride, shift[0], 8,
                              txw_idx, rect_type);
      transpose_16bit_8x8(buf0_cur, buf0_cur);
    }
    col_txfm(buf0, buf0);
    __m128i mshift = _mm_set1_epi16(1 << (15 + shift[1]));
    int k = ud_flip ? (txfm_size_row - 1) : 0;
    const int step = ud_flip ? -1 : 1;
    uint8_t *out = output + 8 * i;
    for (int j = 0; j < txfm_size_row; ++j, k += step) {
      const __m128i v = _mm_loadl_epi64((__m128i const *)(out));
      __m128i res = _mm_mulhrs_epi16(buf0[k], mshift);
      const __m128i u = lowbd_get_recon_8x8_sse2(v, res);
      _mm_storel_epi64((__m128i *)(out), u);
      out += stride;
    }
  }
}